

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O2

void __thiscall CoreML::Specification::ScaleLayerParams::Clear(ScaleLayerParams *this)

{
  (this->shapescale_).current_size_ = 0;
  (this->shapebias_).current_size_ = 0;
  if (this->scale_ != (WeightParams *)0x0) {
    (*(this->scale_->super_MessageLite)._vptr_MessageLite[1])();
  }
  this->scale_ = (WeightParams *)0x0;
  if (this->bias_ != (WeightParams *)0x0) {
    (*(this->bias_->super_MessageLite)._vptr_MessageLite[1])();
  }
  this->bias_ = (WeightParams *)0x0;
  this->hasbias_ = false;
  return;
}

Assistant:

void ScaleLayerParams::Clear() {
// @@protoc_insertion_point(message_clear_start:CoreML.Specification.ScaleLayerParams)
  shapescale_.Clear();
  shapebias_.Clear();
  if (GetArenaNoVirtual() == NULL && scale_ != NULL) {
    delete scale_;
  }
  scale_ = NULL;
  if (GetArenaNoVirtual() == NULL && bias_ != NULL) {
    delete bias_;
  }
  bias_ = NULL;
  hasbias_ = false;
}